

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

char * parse_string(cJSON *item,char *str,char **ep)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar8;
  char *pcVar9;
  size_t sVar10;
  char *pcVar7;
  
  if (*str == '\"') {
    pcVar6 = str + 1;
    sVar10 = 1;
    for (uVar8 = 1; (cVar1 = str[uVar8], cVar1 != '\0' && (cVar1 != '\"'));
        uVar8 = uVar8 + (cVar1 == '\\') + 1) {
      sVar10 = sVar10 + 1;
    }
    pcVar4 = (char *)(*cJSON_malloc)(sVar10);
    if (pcVar4 != (char *)0x0) {
      item->valuestring = pcVar4;
      item->type = 0x10;
      if (1 < uVar8) {
        pcVar9 = str + uVar8;
        do {
          if (*pcVar6 == '\\') {
            pcVar7 = pcVar6 + 1;
            cVar1 = pcVar6[1];
            switch(cVar1) {
            case 'n':
              *pcVar4 = '\n';
              break;
            case 'o':
            case 'p':
            case 'q':
            case 's':
switchD_00103ab6_caseD_6f:
              *pcVar4 = cVar1;
              break;
            case 'r':
              *pcVar4 = '\r';
              break;
            case 't':
              *pcVar4 = '\t';
              break;
            case 'u':
              uVar2 = parse_hex4(pcVar6 + 2);
              if (((pcVar6 + 5 < pcVar9) && (uVar2 != 0)) && ((uVar2 & 0xfc00) != 0xdc00)) {
                if ((uVar2 & 0xfc00) == 0xd800) {
                  if (((pcVar9 < pcVar6 + 0xb) || (pcVar6[6] != '\\')) ||
                     ((pcVar6[7] != 'u' ||
                      (uVar3 = parse_hex4(pcVar6 + 8), uVar3 - 0xe000 < 0xfffffc00))))
                  goto LAB_00103c58;
                  uVar2 = (uVar2 & 0x3ff) * 0x400 + (uVar3 & 0x3ff) + 0x10000;
                }
                iVar5 = 1;
                if ((0x7f < uVar2) && (iVar5 = 2, 0x7ff < uVar2)) {
                  iVar5 = 4 - (uint)(uVar2 < 0x10000);
                }
                pcVar6 = (char *)(*(code *)((long)&DAT_001052e0 +
                                           (long)(int)(&DAT_001052e0)[iVar5 - 1]))();
                return pcVar6;
              }
LAB_00103c58:
              *ep = str;
              return (char *)0x0;
            default:
              if (cVar1 == 'f') {
                *pcVar4 = '\f';
              }
              else {
                if (cVar1 != 'b') goto switchD_00103ab6_caseD_6f;
                *pcVar4 = '\b';
              }
            }
          }
          else {
            *pcVar4 = *pcVar6;
            pcVar7 = pcVar6;
          }
          pcVar4 = pcVar4 + 1;
          pcVar6 = pcVar7 + 1;
        } while (pcVar6 < pcVar9);
      }
      *pcVar4 = '\0';
      return pcVar6 + (*pcVar6 == '\"');
    }
  }
  else {
    *ep = str;
  }
  return (char *)0x0;
}

Assistant:

static const char *parse_string(cJSON *item,const char *str,const char **ep)
{
	const char *ptr=str+1,*end_ptr=str+1;char *ptr2;char *out;int len=0;unsigned uc,uc2;
	if (*str!='\"') {*ep=str;return 0;}	/* not a string! */
	
	while (*end_ptr!='\"' && *end_ptr && ++len) if (*end_ptr++ == '\\') end_ptr++;	/* Skip escaped quotes. */
	
	out=(char*)cJSON_malloc(len+1);	/* This is how long we need for the string, roughly. */
	if (!out) return 0;
	item->valuestring=out; /* assign here so out will be deleted during cJSON_Delete() later */
	item->type=cJSON_String;
	
	ptr=str+1;ptr2=out;
	while (ptr < end_ptr)
	{
		if (*ptr!='\\') *ptr2++=*ptr++;
		else
		{
			ptr++;
			switch (*ptr)
			{
				case 'b': *ptr2++='\b';	break;
				case 'f': *ptr2++='\f';	break;
				case 'n': *ptr2++='\n';	break;
				case 'r': *ptr2++='\r';	break;
				case 't': *ptr2++='\t';	break;
				case 'u':	 /* transcode utf16 to utf8. */
					uc=parse_hex4(ptr+1);ptr+=4;	/* get the unicode char. */
					if (ptr >= end_ptr) {*ep=str;return 0;}	/* invalid */
					
					if ((uc>=0xDC00 && uc<=0xDFFF) || uc==0)    {*ep=str;return 0;}	/* check for invalid.   */
					
					if (uc>=0xD800 && uc<=0xDBFF)	/* UTF16 surrogate pairs.	*/
					{
						if (ptr+6 > end_ptr)    {*ep=str;return 0;}	/* invalid */
						if (ptr[1]!='\\' || ptr[2]!='u')    {*ep=str;return 0;}	/* missing second-half of surrogate.    */
						uc2=parse_hex4(ptr+3);ptr+=6;
						if (uc2<0xDC00 || uc2>0xDFFF)       {*ep=str;return 0;}	/* invalid second-half of surrogate.    */
						uc=0x10000 + (((uc&0x3FF)<<10) | (uc2&0x3FF));
					}

					len=4;if (uc<0x80) len=1;else if (uc<0x800) len=2;else if (uc<0x10000) len=3; ptr2+=len;
					
					switch (len) {
						case 4: *--ptr2 =((uc | 0x80) & 0xBF); uc >>= 6;
						case 3: *--ptr2 =((uc | 0x80) & 0xBF); uc >>= 6;
						case 2: *--ptr2 =((uc | 0x80) & 0xBF); uc >>= 6;
						case 1: *--ptr2 =(uc | firstByteMark[len]);
					}
					ptr2+=len;
					break;
				default:  *ptr2++=*ptr; break;
			}
			ptr++;
		}
	}
	*ptr2=0;
	if (*ptr=='\"') ptr++;
	return ptr;
}